

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.c
# Opt level: O1

natwm_error config_find_string(map *config_map,char *key,char **result)

{
  natwm_error nVar1;
  map_entry *pmVar2;
  int *piVar3;
  
  pmVar2 = map_get(config_map,key);
  if (pmVar2 == (map_entry *)0x0) {
    piVar3 = (int *)0x0;
  }
  else {
    piVar3 = (int *)pmVar2->value;
  }
  if (piVar3 == (int *)0x0) {
    nVar1 = NOT_FOUND_ERROR;
  }
  else {
    nVar1 = INVALID_INPUT_ERROR;
    if (*piVar3 == 3) {
      *result = *(char **)(piVar3 + 2);
      nVar1 = NO_ERROR;
    }
  }
  return nVar1;
}

Assistant:

enum natwm_error config_find_string(const struct map *config_map, const char *key,
                                    const char **result)
{
        struct config_value *value = config_find(config_map, key);

        if (value == NULL) {
                return NOT_FOUND_ERROR;
        }

        if (value->type != STRING) {
                return INVALID_INPUT_ERROR;
        }

        *result = value->data.string;

        return NO_ERROR;
}